

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_data(char *arg)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  undefined8 *__ptr;
  char *pcVar4;
  undefined8 *puVar5;
  FILE *__stream;
  int *piVar6;
  lyd_node *plVar7;
  char *__format;
  uint uVar8;
  ulong uVar9;
  size_t __size;
  size_t sStack_80;
  undefined4 local_6c;
  lyd_node *plStack_68;
  int option_index;
  lyd_node *data;
  char *local_58;
  lyd_node *local_50;
  int local_48;
  LYD_FORMAT local_44;
  FILE *local_40;
  uint local_38;
  uint local_34;
  
  __stream = _stdout;
  local_34 = 0;
  plStack_68 = (lyd_node *)0x0;
  __ptr = (undefined8 *)malloc(0x10);
  pcVar4 = strdup(arg);
  *__ptr = pcVar4;
  strtok(pcVar4," ");
  data = (lyd_node *)0xffffffffffffffff;
  __size = 0x18;
  while (pcVar4 = strtok((char *)0x0," "), pcVar4 != (char *)0x0) {
    puVar5 = (undefined8 *)realloc(__ptr,__size);
    pFVar1 = _stderr;
    if (puVar5 == (undefined8 *)0x0) {
      iVar2 = 1;
      piVar6 = __errno_location();
      pcVar4 = strerror(*piVar6);
      local_50 = (lyd_node *)0x0;
      fprintf(pFVar1,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x2ae,pcVar4);
      goto LAB_00107ade;
    }
    *(char **)((long)puVar5 + (__size - 0x10)) = pcVar4;
    data = (lyd_node *)((long)&data[-1].child + 7);
    __size = __size + 8;
    __ptr = puVar5;
  }
  local_40 = __stream;
  uVar9 = -(long)data;
  __ptr[uVar9 & 0xffffffff] = 0;
  _optind = 0;
  uVar8 = 0;
  local_38 = 0;
  local_58 = (char *)0x0;
  local_50 = (lyd_node *)0x0;
  local_48 = 0;
  local_44 = LYD_UNKNOWN;
switchD_001075b1_caseD_65:
  local_6c = 0;
  iVar2 = getopt_long(uVar9 & 0xffffffff,__ptr,"d:hf:F:o:st:r:",cmd_data::long_options,&local_6c);
  __stream = local_40;
  pcVar4 = _optarg;
  switch(iVar2) {
  case 100:
    iVar2 = strcmp(_optarg,"all");
    if (iVar2 == 0) {
      local_38 = local_38 & 0xffffff0f | 0x20;
    }
    else {
      iVar2 = strcmp(pcVar4,"all-tagged");
      if (iVar2 == 0) {
        local_38 = local_38 & 0xffffff0f | 0x40;
      }
      else {
        iVar2 = strcmp(pcVar4,"trim");
        if (iVar2 == 0) {
          local_38 = local_38 & 0xffffff0f | 0x10;
        }
        else {
          iVar2 = strcmp(pcVar4,"implicit-tagged");
          if (iVar2 == 0) {
            local_38 = local_38 & 0xffffff0f | 0x80;
          }
        }
      }
    }
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
    goto switchD_001075b1_caseD_65;
  case 0x66:
    iVar2 = strcmp(_optarg,"xml");
    local_48 = 1;
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar4,"json");
      local_48 = 2;
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar4,"lyb");
        local_48 = 3;
        if (iVar2 != 0) {
          __format = "Unknown output format \"%s\".\n";
          goto LAB_00107b86;
        }
      }
    }
    goto switchD_001075b1_caseD_65;
  case 0x68:
    goto switchD_001075b1_caseD_68;
  case 0x6f:
    if (local_58 == (char *)0x0) {
      local_58 = _optarg;
      goto switchD_001075b1_caseD_65;
    }
    pcVar4 = "Output specified twice.\n";
    sStack_80 = 0x18;
    break;
  case 0x72:
    if ((local_50 == (lyd_node *)0x0) && ((uVar8 & 0x8000) == 0)) {
      if (*_optarg == '!') {
        uVar8 = uVar8 | 0x8000;
        local_50 = (lyd_node *)0x0;
      }
      else {
        local_50 = (lyd_node *)lyd_parse_path(ctx,_optarg,1,0x10000);
        if (local_50 == (lyd_node *)0x0) {
          local_34 = uVar8;
          fwrite("Failed to parse the additional data tree for validation.\n",0x39,1,_stderr);
          iVar2 = 1;
          local_50 = (lyd_node *)0x0;
          __stream = local_40;
          goto LAB_00107ade;
        }
      }
      goto switchD_001075b1_caseD_65;
    }
    pcVar4 = "The running datastore (-r) cannot be set multiple times.\n";
    sStack_80 = 0x39;
    break;
  case 0x73:
    uVar8 = uVar8 | 0xa00;
    goto switchD_001075b1_caseD_65;
  case 0x74:
    iVar2 = strcmp(_optarg,"auto");
    if (iVar2 == 0) {
      uVar8 = uVar8 | 0x10000ff;
    }
    else {
      iVar2 = strcmp(pcVar4,"data");
      if (iVar2 == 0) {
        uVar8 = uVar8 & 0xfeffff00;
      }
      else {
        iVar2 = strcmp(pcVar4,"config");
        if (iVar2 == 0) {
          uVar8 = (uVar8 & 0xfeffff00) + 1;
        }
        else {
          iVar2 = strcmp(pcVar4,"get");
          if (iVar2 == 0) {
            uVar8 = uVar8 & 0xfeffff00 | 2;
          }
          else {
            iVar2 = strcmp(pcVar4,"getconfig");
            if (iVar2 == 0) {
              uVar8 = uVar8 & 0xfeffff00 | 4;
            }
            else {
              iVar2 = strcmp(pcVar4,"edit");
              if (iVar2 == 0) {
                uVar8 = uVar8 & 0xfeffff00 | 8;
              }
              else {
                iVar2 = strcmp(pcVar4,"rpc");
                if (iVar2 == 0) {
                  uVar8 = uVar8 & 0xfeffff00 | 0x10;
                }
                else {
                  iVar2 = strcmp(pcVar4,"rpcreply");
                  if (iVar2 == 0) {
                    uVar8 = uVar8 & 0xfeffff00 | 0x20;
                  }
                  else {
                    iVar2 = strcmp(pcVar4,"notif");
                    if (iVar2 == 0) {
                      uVar8 = uVar8 & 0xfeffff00 | 0x40;
                    }
                    else {
                      iVar2 = strcmp(pcVar4,"yangdata");
                      if (iVar2 != 0) {
                        local_34 = uVar8;
                        fprintf(_stderr,"Invalid parser option \"%s\".\n",pcVar4);
                        cmd_data_help();
                        goto LAB_00107b90;
                      }
                      uVar8 = uVar8 & 0xfeffff00 | 0x1000000;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto switchD_001075b1_caseD_65;
  default:
    if (iVar2 == 0x46) goto LAB_0010781d;
    if (iVar2 == -1) {
      if ((int)data + _optind == 0) {
        local_34 = uVar8;
        fwrite("Missing the data file name.\n",0x1c,1,_stderr);
        iVar2 = 1;
      }
      else {
        local_34 = uVar8;
        iVar3 = parse_data((char *)__ptr[_optind],local_44,(int *)&local_34,local_50,
                           (char *)__ptr[(long)_optind + 1],&stack0xffffffffffffff98);
        iVar2 = 1;
        if (iVar3 == 0) {
          if ((local_58 == (char *)0x0) ||
             (__stream = fopen(local_58,"w"), pFVar1 = _stderr, __stream != (FILE *)0x0)) {
            iVar2 = 0;
            if (local_48 != 0) {
              plVar7 = plStack_68;
              if ((local_34 & 0x20) != 0) {
                plVar7 = plStack_68->child;
              }
              lyd_print_file(__stream,plVar7,local_48,local_38 | 3);
            }
          }
          else {
            piVar6 = __errno_location();
            pcVar4 = strerror(*piVar6);
            fprintf(pFVar1,"Could not open the output file (%s).\n",pcVar4);
            __stream = (FILE *)0x0;
          }
        }
      }
      goto LAB_00107ade;
    }
    if (iVar2 == 0x3f) {
      local_34 = uVar8;
      fprintf(_stderr,"Unknown option \"%d\".\n",0x3f);
      goto LAB_00107b90;
    }
    goto switchD_001075b1_caseD_65;
  }
  local_34 = uVar8;
  fwrite(pcVar4,sStack_80,1,_stderr);
  goto LAB_00107b90;
LAB_0010781d:
  iVar2 = strcmp(_optarg,"xml");
  local_44 = LYD_XML;
  if (iVar2 != 0) {
    iVar2 = strcmp(pcVar4,"json");
    local_44 = LYD_JSON;
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar4,"lyb");
      local_44 = LYD_LYB;
      if (iVar2 != 0) {
        __format = "Unknown input format \"%s\".\n";
LAB_00107b86:
        local_34 = uVar8;
        fprintf(_stderr,__format,pcVar4);
LAB_00107b90:
        iVar2 = 1;
        __stream = local_40;
        goto LAB_00107ade;
      }
    }
  }
  goto switchD_001075b1_caseD_65;
switchD_001075b1_caseD_68:
  local_34 = uVar8;
  cmd_data_help();
  iVar2 = 0;
  __stream = local_40;
LAB_00107ade:
  free((void *)*__ptr);
  free(__ptr);
  if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
    fclose(__stream);
  }
  lyd_free_withsiblings(local_50);
  lyd_free_withsiblings(plStack_68);
  return iVar2;
}

Assistant:

int
cmd_data(const char *arg)
{
    int c, argc, option_index, ret = 1;
    int options = 0, printopt = 0;
    char **argv = NULL, *ptr;
    const char *out_path = NULL;
    struct lyd_node *data = NULL, *val_tree = NULL;
    LYD_FORMAT outformat = LYD_UNKNOWN, informat = LYD_UNKNOWN;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"defaults", required_argument, 0, 'd'},
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"in-format", required_argument, 0, 'F'},
        {"option", required_argument, 0, 't'},
        {"output", required_argument, 0, 'o'},
        {"running", required_argument, 0, 'r'},
        {"strict", no_argument, 0, 's'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "d:hf:F:o:st:r:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'd':
            if (!strcmp(optarg, "all")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL;
            } else if (!strcmp(optarg, "all-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL_TAG;
            } else if (!strcmp(optarg, "trim")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_TRIM;
            } else if (!strcmp(optarg, "implicit-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_IMPL_TAG;
            }
            break;
        case 'h':
            cmd_data_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                outformat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'F':
            if (!strcmp(optarg, "xml")) {
                informat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                informat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                informat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown input format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'r':
            if (val_tree || (options & LYD_OPT_NOEXTDEPS)) {
                fprintf(stderr, "The running datastore (-r) cannot be set multiple times.\n");
                goto cleanup;
            }
            if (optarg[0] == '!') {
                /* ignore extenral dependencies to the running datastore */
                options |= LYD_OPT_NOEXTDEPS;
            } else {
                /* external file with the running datastore */
                val_tree = lyd_parse_path(ctx, optarg, LYD_XML, LYD_OPT_DATA_NO_YANGLIB);
                if (!val_tree) {
                    fprintf(stderr, "Failed to parse the additional data tree for validation.\n");
                    goto cleanup;
                }
            }
            break;
        case 's':
            options |= LYD_OPT_STRICT;
            options |= LYD_OPT_OBSOLETE;
            break;
        case 't':
            if (!strcmp(optarg, "auto")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_TYPEMASK;
            } else if (!strcmp(optarg, "data")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA;
            } else if (!strcmp(optarg, "config")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_CONFIG;
            } else if (!strcmp(optarg, "get")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GET;
            } else if (!strcmp(optarg, "getconfig")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GETCONFIG;
            } else if (!strcmp(optarg, "edit")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_EDIT;
            } else if (!strcmp(optarg, "rpc")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPC;
            } else if (!strcmp(optarg, "rpcreply")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPCREPLY;
            } else if (!strcmp(optarg, "notif")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_NOTIF;
            } else if (!strcmp(optarg, "yangdata")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_TEMPLATE;
            } else {
                fprintf(stderr, "Invalid parser option \"%s\".\n", optarg);
                cmd_data_help();
                goto cleanup;
            }
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the data file name.\n");
        goto cleanup;
    }

    if (parse_data(argv[optind], informat, &options, val_tree, argv[optind + 1], &data)) {
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    if (outformat != LYD_UNKNOWN) {
        if (options & LYD_OPT_RPCREPLY) {
            lyd_print_file(output, data->child, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        } else {
            lyd_print_file(output, data, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        }
    }

    ret = 0;

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    lyd_free_withsiblings(val_tree);
    lyd_free_withsiblings(data);

    return ret;
}